

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t psa_get_rsa_public_exponent(mbedtls_rsa_context *rsa,psa_key_attributes_t *attributes)

{
  int iVar1;
  psa_status_t pVar2;
  size_t __size;
  size_t buflen;
  uint8_t *buffer;
  undefined1 local_30 [4];
  int ret;
  mbedtls_mpi mpi;
  psa_key_attributes_t *attributes_local;
  mbedtls_rsa_context *rsa_local;
  
  buflen = 0;
  mpi.p = (mbedtls_mpi_uint *)attributes;
  mbedtls_mpi_init((mbedtls_mpi *)local_30);
  buffer._4_4_ = mbedtls_rsa_export(rsa,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,(mbedtls_mpi *)0x0,
                                    (mbedtls_mpi *)0x0,(mbedtls_mpi *)local_30);
  if ((buffer._4_4_ == 0) &&
     (iVar1 = mbedtls_mpi_cmp_int((mbedtls_mpi *)local_30,0x10001), iVar1 != 0)) {
    __size = mbedtls_mpi_size((mbedtls_mpi *)local_30);
    buflen = (size_t)calloc(1,__size);
    if ((uchar *)buflen == (uchar *)0x0) {
      buffer._4_4_ = -0x10;
    }
    else {
      buffer._4_4_ = mbedtls_mpi_write_binary((mbedtls_mpi *)local_30,(uchar *)buflen,__size);
      if (buffer._4_4_ == 0) {
        mpi.p[4] = buflen;
        mpi.p[5] = __size;
      }
    }
  }
  mbedtls_mpi_free((mbedtls_mpi *)local_30);
  if (buffer._4_4_ != 0) {
    free((void *)buflen);
  }
  pVar2 = mbedtls_to_psa_error(buffer._4_4_);
  return pVar2;
}

Assistant:

static psa_status_t psa_get_rsa_public_exponent(
    const mbedtls_rsa_context *rsa,
    psa_key_attributes_t *attributes )
{
    mbedtls_mpi mpi;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint8_t *buffer = NULL;
    size_t buflen;
    mbedtls_mpi_init( &mpi );

    ret = mbedtls_rsa_export( rsa, NULL, NULL, NULL, NULL, &mpi );
    if( ret != 0 )
        goto exit;
    if( mbedtls_mpi_cmp_int( &mpi, 65537 ) == 0 )
    {
        /* It's the default value, which is reported as an empty string,
         * so there's nothing to do. */
        goto exit;
    }

    buflen = mbedtls_mpi_size( &mpi );
    buffer = mbedtls_calloc( 1, buflen );
    if( buffer == NULL )
    {
        ret = MBEDTLS_ERR_MPI_ALLOC_FAILED;
        goto exit;
    }
    ret = mbedtls_mpi_write_binary( &mpi, buffer, buflen );
    if( ret != 0 )
        goto exit;
    attributes->domain_parameters = buffer;
    attributes->domain_parameters_size = buflen;

exit:
    mbedtls_mpi_free( &mpi );
    if( ret != 0 )
        mbedtls_free( buffer );
    return( mbedtls_to_psa_error( ret ) );
}